

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gen.hpp
# Opt level: O0

void __thiscall rc::Gen<unsigned_long>::~Gen(Gen<unsigned_long> *this)

{
  Gen<unsigned_long> *this_local;
  
  if (this->m_impl != (IGenImpl *)0x0) {
    (*this->m_impl->_vptr_IGenImpl[2])();
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

Gen<T>::~Gen() noexcept {
  if (m_impl) {
    m_impl->release();
  }
}